

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reader.cpp
# Opt level: O3

string * __thiscall
ninx::lexer::Reader::read_until_limiter_abi_cxx11_(string *__return_storage_ptr__,Reader *this)

{
  pointer *ppcVar1;
  char *pcVar2;
  pointer pcVar3;
  iterator iVar4;
  bool bVar5;
  bool bVar6;
  vector<char,std::allocator<char>> *pvVar7;
  string sVar8;
  char cVar9;
  int iVar10;
  long lVar11;
  bool bVar12;
  char current;
  allocator local_59;
  vector<char,std::allocator<char>> *local_58;
  string local_50;
  undefined7 uStack_4f;
  size_type local_48;
  size_type local_40;
  undefined8 uStack_38;
  
  pcVar3 = (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_finish != pcVar3) {
    (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar3;
  }
  local_58 = (vector<char,std::allocator<char>> *)&this->buffer;
  if (((byte)this->stream[*(long *)(*(long *)this->stream + -0x18) + 0x20] & 5) == 0) {
    bVar6 = false;
    do {
      cVar9 = std::istream::peek();
      if (cVar9 == '\\') {
        std::istream::get();
      }
      else {
        lVar11 = 0;
        do {
          pcVar2 = &LIMITER_CHARS + lVar11;
          if (*pcVar2 == cVar9) break;
          bVar12 = lVar11 != 0x11;
          lVar11 = lVar11 + 1;
        } while (bVar12);
        if (cVar9 != '-' && *pcVar2 == cVar9) break;
      }
      local_50 = (string)std::istream::get();
      if (local_50 == (string)0x2d) {
        iVar10 = std::istream::peek();
        if (9 < iVar10 - 0x30U) {
          std::istream::seekg((long)this->stream,~_S_beg);
          break;
        }
      }
      else if (local_50 == (string)0xff) break;
      sVar8 = local_50;
      bVar12 = local_50 == (string)0xa;
      if (bVar12) {
        this->line_number = this->line_number + 1;
LAB_0010d25f:
        iVar4._M_current =
             (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        bVar6 = bVar12;
        if (iVar4._M_current ==
            (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                    (local_58,iVar4,(char *)&local_50);
        }
        else {
          *iVar4._M_current = (char)sVar8;
          ppcVar1 = &(this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppcVar1 = *ppcVar1 + 1;
        }
      }
      else {
        iVar10 = isspace((int)(char)local_50);
        bVar5 = (bool)(iVar10 != 0 & bVar6);
        bVar6 = true;
        if (!bVar5) goto LAB_0010d25f;
      }
    } while (((byte)this->stream[*(long *)(*(long *)this->stream + -0x18) + 0x20] & 5) == 0);
  }
  pvVar7 = local_58;
  local_50 = (string)0x0;
  iVar4._M_current =
       (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage) {
    std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
              ((vector<char,_std::allocator<char>_> *)local_58,iVar4,(char *)&local_50);
  }
  else {
    *iVar4._M_current = '\0';
    ppcVar1 = &(this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppcVar1 = *ppcVar1 + 1;
  }
  std::__cxx11::string::string(&local_50,*(char **)pvVar7,&local_59);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((size_type *)CONCAT71(uStack_4f,local_50) == &local_40) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_40;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_38;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)CONCAT71(uStack_4f,local_50);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_40;
  }
  __return_storage_ptr__->_M_string_length = local_48;
  return __return_storage_ptr__;
}

Assistant:

std::string ninx::lexer::Reader::read_until_limiter() {
    this->buffer.clear();

    bool line_started {false};  // Used to discard indentations

    while (stream) {
        // Check if the next char is one of the limiting ones
        char next_char = static_cast<char>(stream.peek());
        if (next_char == '\\') {   // Escaping control
            stream.get();  // Discard the escaping char, and avoid limiter check so char is considered as text
        }else{
            if (is_limiter(next_char) && next_char != '-') {  // Exception is for negative number handling
                break;
            }
        }

        // Read the current char
        char current = static_cast<char>(stream.get());
        if (current == -1) {
            break;
        }

        if (current == '-' && !isdigit(stream.peek())) {  // Not a negative number, rollback
            this->stream.seekg(-1, std::ios_base::cur);
            break;
        }

        if (current == '\n') { // Increment the line count if a newline was found
            this->increment_line();
            line_started = true;
        }else{
            if (!isspace(current)) {
                line_started = false;
            }
        }

        // Allow newlines and chars only if they are not the first space ( indentation )
        if ( current == '\n' || !line_started ) {
            this->buffer.push_back(current);
        }
    }

    this->buffer.push_back(0);

    return std::move(std::string{buffer.data()});
}